

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplaceRealloc<std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *this,pointer pos,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  ulong uVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> *__cur_1;
  size_t *psVar3;
  pointer pbVar4;
  size_t *psVar5;
  pointer pbVar6;
  EVP_PKEY_CTX *pEVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar7 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar7 < ctx) {
    pEVar7 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar7 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar8 = (long)pos - *(long *)this;
  psVar3 = (size_t *)operator_new((long)pEVar7 << 4);
  pcVar2 = args->_M_str;
  *(size_t *)((long)psVar3 + lVar8) = args->_M_len;
  ((size_t *)((long)psVar3 + lVar8))[1] = (size_t)pcVar2;
  pbVar6 = *(pointer *)this;
  pbVar4 = pbVar6 + *(long *)(this + 8);
  psVar5 = psVar3;
  if (pbVar4 == pos) {
    for (; pbVar6 != pos; pbVar6 = pbVar6 + 1) {
      pcVar2 = pbVar6->_M_str;
      *psVar5 = pbVar6->_M_len;
      psVar5[1] = (size_t)pcVar2;
      psVar5 = psVar5 + 2;
    }
  }
  else {
    for (; pbVar6 != pos; pbVar6 = pbVar6 + 1) {
      pcVar2 = pbVar6->_M_str;
      *psVar5 = pbVar6->_M_len;
      psVar5[1] = (size_t)pcVar2;
      psVar5 = psVar5 + 2;
    }
    psVar5 = (size_t *)(lVar8 + (long)psVar3);
    for (; pos != pbVar4; pos = pos + 1) {
      pcVar2 = pos->_M_str;
      psVar5[2] = pos->_M_len;
      psVar5[3] = (size_t)pcVar2;
      psVar5 = psVar5 + 2;
    }
  }
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
            ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar7;
  *(size_t **)this = psVar3;
  return (pointer)((long)psVar3 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}